

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapyRateTest.cpp
# Opt level: O1

void runRateTestStreamLoop
               (Device *device,Stream *stream,int direction,size_t numChans,size_t elemSize)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  char *__s;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int flags;
  longlong timeNs;
  vector<void_*,_std::allocator<void_*>_> buffs;
  size_t chanMask;
  int flags_1;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  buffMem;
  longlong timeNs_1;
  undefined4 local_e4;
  undefined8 local_e0;
  uint local_d4;
  vector<char,_std::allocator<char>_> local_d0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  allocator_type local_80 [12];
  undefined1 local_74 [4];
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_70;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined1 local_38 [8];
  
  local_90 = (**(code **)(*(long *)device + 0x78))();
  std::vector<char,_std::allocator<char>_>::vector
            (&local_d0,local_90 * elemSize,(allocator_type *)&local_e0);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&local_70,numChans,&local_d0,local_80);
  if (local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&local_d0,numChans,
             (allocator_type *)&local_e0);
  if (numChans != 0) {
    lVar7 = 0;
    sVar9 = 0;
    do {
      *(undefined8 *)
       (local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + sVar9 * 8) =
           *(undefined8 *)
            ((long)&((local_70.
                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
                    ._M_start + lVar7);
      sVar9 = sVar9 + 1;
      lVar7 = lVar7 + 0x18;
    } while (numChans != sVar9);
  }
  local_88 = std::chrono::_V2::system_clock::now();
  local_b0 = std::chrono::_V2::system_clock::now();
  local_a0 = std::chrono::_V2::system_clock::now();
  local_a8 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting stream loop, press Ctrl+C to exit...",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  (**(code **)(*(long *)device + 0x80))(device,stream,0,0,0);
  signal(2,sigIntHandler);
  auVar13._8_4_ = (int)(numChans >> 0x20);
  auVar13._0_8_ = numChans;
  auVar13._12_4_ = 0x45300000;
  dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)numChans) - 4503599627370496.0);
  auVar14._8_4_ = (int)(elemSize >> 0x20);
  auVar14._0_8_ = elemSize;
  auVar14._12_4_ = 0x45300000;
  dStack_50 = auVar14._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)elemSize) - 4503599627370496.0);
  uVar10 = 0;
  uVar11 = 0;
  local_98 = 0;
  local_b8 = 0;
  do {
    if (loopDone != '\0') break;
    local_e4 = 0;
    local_e0 = 0;
    if (direction == 0) {
      uVar4 = (**(code **)(*(long *)device + 0x98))
                        (device,stream,
                         local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,local_90,&local_e4,0,100000);
    }
    else {
      uVar4 = 0;
      if (direction == 1) {
        uVar4 = (**(code **)(*(long *)device + 0x90))
                          (device,stream,
                           local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,local_90,&local_e4,&local_e0,100000);
      }
    }
    if (uVar4 == 0xfffffff9) {
      uVar11 = uVar11 + 1;
LAB_0010ba6d:
      bVar2 = false;
    }
    else {
      if (uVar4 == 0xffffffff) goto LAB_0010ba6d;
      if (uVar4 == 0xfffffffc) {
        uVar10 = uVar10 + 1;
        goto LAB_0010ba6d;
      }
      if ((int)uVar4 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unexpected stream error ",0x18);
        __s = (char *)SoapySDR::errToStr(uVar4);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x112308);
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
        std::ostream::put('\b');
        bVar2 = true;
        std::ostream::flush();
      }
      else {
        lVar7 = std::chrono::_V2::system_clock::now();
        if (local_a0 + 300000000 < lVar7) {
          uVar1 = (uint)local_b8;
          local_d4 = uVar1 + 1;
          uVar5 = uVar1 + 3;
          if (-1 < (int)uVar1) {
            uVar5 = uVar1;
          }
          printf("\b%c",(ulong)(uint)(int)"|/-\\"[(int)(uVar1 - (uVar5 & 0xfffffffc))]);
          fflush(_stdout);
          local_b8 = (ulong)local_d4;
          local_a0 = lVar7;
        }
        lVar3 = local_a8;
        if (local_a8 + 1000000000 < lVar7) {
          do {
            iVar6 = (**(code **)(*(long *)device + 0xa0))(device,stream,local_80,local_74,local_38);
            if (iVar6 == -7) {
              uVar11 = uVar11 + 1;
LAB_0010bb3e:
              bVar2 = true;
            }
            else {
              if (iVar6 == -6) goto LAB_0010bb3e;
              if (iVar6 == -4) {
                uVar10 = uVar10 + 1;
                goto LAB_0010bb3e;
              }
              bVar2 = false;
            }
            lVar3 = lVar7;
          } while (bVar2);
        }
        local_a8 = lVar3;
        local_98 = local_98 + (ulong)uVar4;
        if (local_b0 + 5000000000 < lVar7) {
          auVar15._8_4_ = (int)((ulong)local_98 >> 0x20);
          auVar15._0_8_ = local_98;
          auVar15._12_4_ = 0x45300000;
          dVar12 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_98) - 4503599627370496.0)) /
                   (double)((lVar7 - local_88) / 1000);
          printf("\b%g Msps\t%g MBps",dVar12,dVar12 * local_48 * local_58);
          if (uVar10 != 0) {
            printf("\tOverflows %u",(ulong)uVar10);
          }
          if (uVar11 != 0) {
            printf("\tUnderflows %u",(ulong)uVar11);
          }
          printf("\n ");
          local_b0 = lVar7;
        }
        bVar2 = false;
      }
    }
  } while (!bVar2);
  (**(code **)(*(long *)device + 0x88))(device,stream,0,0);
  if (local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return;
}

Assistant:

void runRateTestStreamLoop(
    SoapySDR::Device *device,
    SoapySDR::Stream *stream,
    const int direction,
    const size_t numChans,
    const size_t elemSize)
{
    //allocate buffers for the stream read/write
    const size_t numElems = device->getStreamMTU(stream);
    std::vector<std::vector<char>> buffMem(numChans, std::vector<char>(elemSize*numElems));
    std::vector<void *> buffs(numChans);
    for (size_t i = 0; i < numChans; i++) buffs[i] = buffMem[i].data();

    //state collected in this loop
    unsigned int overflows(0);
    unsigned int underflows(0);
    unsigned long long totalSamples(0);
    const auto startTime = std::chrono::high_resolution_clock::now();
    auto timeLastPrint = std::chrono::high_resolution_clock::now();
    auto timeLastSpin = std::chrono::high_resolution_clock::now();
    auto timeLastStatus = std::chrono::high_resolution_clock::now();
    int spinIndex(0);

    std::cout << "Starting stream loop, press Ctrl+C to exit..." << std::endl;
    device->activateStream(stream);
    signal(SIGINT, sigIntHandler);
    while (not loopDone)
    {
        int ret(0);
        int flags(0);
        long long timeNs(0);
        switch(direction)
        {
        case SOAPY_SDR_RX:
            ret = device->readStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        case SOAPY_SDR_TX:
            ret = device->writeStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        }

        if (ret == SOAPY_SDR_TIMEOUT) continue;
        if (ret == SOAPY_SDR_OVERFLOW)
        {
            overflows++;
            continue;
        }
        if (ret == SOAPY_SDR_UNDERFLOW)
        {
            underflows++;
            continue;
        }
        if (ret < 0)
        {
            std::cerr << "Unexpected stream error " << SoapySDR::errToStr(ret) << std::endl;
            break;
        }
        totalSamples += ret;

        const auto now = std::chrono::high_resolution_clock::now();
        if (timeLastSpin + std::chrono::milliseconds(300) < now)
        {
            timeLastSpin = now;
            static const char spin[] = {"|/-\\"};
            printf("\b%c", spin[(spinIndex++)%4]);
            fflush(stdout);
        }
        //occasionally read out the stream status (non blocking)
        if (timeLastStatus + std::chrono::seconds(1) < now)
        {
            timeLastStatus = now;
            while (true)
            {
                size_t chanMask; int flags; long long timeNs;
                ret = device->readStreamStatus(stream, chanMask, flags, timeNs, 0);
                if (ret == SOAPY_SDR_OVERFLOW) overflows++;
                else if (ret == SOAPY_SDR_UNDERFLOW) underflows++;
                else if (ret == SOAPY_SDR_TIME_ERROR) {}
                else break;
            }
        }
        if (timeLastPrint + std::chrono::seconds(5) < now)
        {
            timeLastPrint = now;
            const auto timePassed = std::chrono::duration_cast<std::chrono::microseconds>(now - startTime);
            const auto sampleRate = double(totalSamples)/timePassed.count();
            printf("\b%g Msps\t%g MBps", sampleRate, sampleRate*numChans*elemSize);
            if (overflows != 0) printf("\tOverflows %u", overflows);
            if (underflows != 0) printf("\tUnderflows %u", underflows);
            printf("\n ");
        }

    }
    device->deactivateStream(stream);
}